

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitStringNew(BinaryInstWriter *this,StringNew *curr)

{
  StringNewOp SVar1;
  bool bVar2;
  U32LEB x;
  BufferWithRandomAccess *this_00;
  
  bVar2 = wasm::Type::isNull(&curr->ref->type);
  if (bVar2) {
    emitUnreachable(this);
    return;
  }
  BufferWithRandomAccess::operator<<(this->o,-5);
  SVar1 = curr->op;
  if (SVar1 == StringNewFromCodePoint) {
    this_00 = this->o;
    x.value = 0xa9;
  }
  else if (SVar1 == StringNewWTF16Array) {
    this_00 = this->o;
    x.value = 0xb1;
  }
  else {
    if (SVar1 != StringNewLossyUTF8Array) {
      handle_unreachable("invalid string.new*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x9fa);
    }
    this_00 = this->o;
    x.value = 0xb4;
  }
  BufferWithRandomAccess::operator<<(this_00,x);
  return;
}

Assistant:

void BinaryInstWriter::visitStringNew(StringNew* curr) {
  if (curr->ref->type.isNull()) {
    // This is a bottom type, so this is an array-receiving operation that does
    // not receive an array. The spec allows this, but V8 does not, see
    // https://github.com/WebAssembly/stringref/issues/66
    // For now, just emit an unreachable here as this will definitely trap.
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringNewLossyUTF8Array:
      o << U32LEB(BinaryConsts::StringNewLossyUTF8Array);
      break;
    case StringNewWTF16Array:
      o << U32LEB(BinaryConsts::StringNewWTF16Array);
      break;
    case StringNewFromCodePoint:
      o << U32LEB(BinaryConsts::StringFromCodePoint);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}